

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void parse_argument(vid_dec_ctx_t *ps_app_ctx,CHAR *argument,CHAR *value)

{
  ARGUMENT_T AVar1;
  int iVar2;
  IVD_SOC_T IVar3;
  char *pcVar4;
  
  AVar1 = get_argument(argument);
  switch(AVar1) {
  case HELP:
    print_usage();
    exit(-1);
  case VERSION:
    return;
  case INPUT_FILE:
    ps_app_ctx = (vid_dec_ctx_t *)ps_app_ctx->ac_ip_fname;
    goto LAB_00109bfd;
  case OUTPUT:
    ps_app_ctx = (vid_dec_ctx_t *)ps_app_ctx->ac_op_fname;
    goto LAB_00109bfd;
  case CHKSUM:
    ps_app_ctx = (vid_dec_ctx_t *)ps_app_ctx->ac_op_chksum_fname;
    goto LAB_00109bfd;
  case SAVE_OUTPUT:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->u4_file_save_flag;
    break;
  case SAVE_CHKSUM:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->u4_chksum_save_flag;
    break;
  case CHROMA_FORMAT:
    iVar2 = strcmp(value,"YUV_420P");
    if (iVar2 != 0) {
      iVar2 = strcmp(value,"YUV_422ILE");
      if (iVar2 == 0) {
        ps_app_ctx->e_output_chroma_format = IV_YUV_422ILE;
        return;
      }
      iVar2 = strcmp(value,"RGB_565");
      if (iVar2 == 0) {
        ps_app_ctx->e_output_chroma_format = IV_RGB_565;
        return;
      }
      iVar2 = strcmp(value,"RGBA_8888");
      if (iVar2 == 0) {
        ps_app_ctx->e_output_chroma_format = IV_RGBA_8888;
        return;
      }
      iVar2 = strcmp(value,"YUV_420SP_UV");
      if (iVar2 == 0) {
        ps_app_ctx->e_output_chroma_format = IV_YUV_420SP_UV;
        return;
      }
      iVar2 = strcmp(value,"YUV_420SP_VU");
      if (iVar2 == 0) {
        ps_app_ctx->e_output_chroma_format = IV_YUV_420SP_VU;
        return;
      }
      puts("\nInvalid colour format setting it to IV_YUV_420P");
    }
    ps_app_ctx->e_output_chroma_format = IV_YUV_420P;
    return;
  case NUM_FRAMES:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->u4_max_frm_ts;
    break;
  case NUM_CORES:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->u4_num_cores;
    break;
  case SHARE_DISPLAY_BUF:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->share_disp_buf;
    break;
  case LOOPBACK:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->loopback;
    break;
  case DISPLAY:
    ps_app_ctx->display = 0;
    return;
  case FULLSCREEN:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->full_screen;
    break;
  case FPS:
    __isoc99_sscanf(value,"%d",&ps_app_ctx->fps);
    if (ps_app_ctx->fps == 0) {
      ps_app_ctx->fps = 0x1e;
      return;
    }
    return;
  default:
    printf("Ignoring argument :  %s\n",argument);
    return;
  case DEGRADE_TYPE:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->i4_degrade_type;
    break;
  case DEGRADE_PICS:
    ps_app_ctx = (vid_dec_ctx_t *)&ps_app_ctx->i4_degrade_pics;
    break;
  case ARCH:
    iVar2 = strcmp(value,"ARM_NONEON");
    if (iVar2 == 0) {
      ps_app_ctx->e_arch = ARCH_ARM_NONEON;
      return;
    }
    iVar2 = strcmp(value,"ARM_A9Q");
    if (iVar2 != 0) {
      iVar2 = strcmp(value,"ARM_A7");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_ARM_A7;
        return;
      }
      iVar2 = strcmp(value,"ARM_A5");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_ARM_A5;
        return;
      }
      iVar2 = strcmp(value,"ARM_NEONINTR");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_ARM_NEONINTR;
        return;
      }
      iVar2 = strcmp(value,"X86_GENERIC");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_X86_GENERIC;
        return;
      }
      iVar2 = strcmp(value,"X86_SSSE3");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_X86_SSSE3;
        return;
      }
      iVar2 = strcmp(value,"X86_SSE42");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_X86_SSE42;
        return;
      }
      iVar2 = strcmp(value,"X86_AVX2");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_X86_AVX2;
        return;
      }
      iVar2 = strcmp(value,"MIPS_GENERIC");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_MIPS_GENERIC;
        return;
      }
      iVar2 = strcmp(value,"MIPS_32");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_MIPS_32;
        return;
      }
      iVar2 = strcmp(value,"ARMV8_GENERIC");
      if (iVar2 == 0) {
        ps_app_ctx->e_arch = ARCH_ARMV8_GENERIC;
        return;
      }
      puts("\nInvalid Arch. Setting it to ARM_A9Q");
    }
    ps_app_ctx->e_arch = ARCH_ARM_A9Q;
    return;
  case SOC:
    iVar2 = strcmp(value,"GENERIC");
    if (iVar2 == 0) {
      ps_app_ctx->e_soc = SOC_GENERIC;
      return;
    }
    iVar2 = strcmp(value,"HISI_37X");
    if (iVar2 != 0) {
      IVar3 = atoi(value);
      ps_app_ctx->e_soc = IVar3;
      return;
    }
    ps_app_ctx->e_soc = SOC_HISI_37X;
    return;
  case PICLEN:
    break;
  case PICLEN_FILE:
    ps_app_ctx = (vid_dec_ctx_t *)ps_app_ctx->ac_piclen_fname;
LAB_00109bfd:
    pcVar4 = "%s";
    goto LAB_00109d7e;
  }
  pcVar4 = "%d";
LAB_00109d7e:
  __isoc99_sscanf(value,pcVar4,ps_app_ctx);
  return;
}

Assistant:

void parse_argument(vid_dec_ctx_t *ps_app_ctx, CHAR *argument, CHAR *value)
{
    ARGUMENT_T arg;

    arg = get_argument(argument);
    switch(arg)
    {
        case HELP:
            print_usage();
            exit(-1);
        case VERSION:
            break;
        case INPUT_FILE:
            sscanf(value, "%s", ps_app_ctx->ac_ip_fname);
            //input_passed = 1;
            break;

        case OUTPUT:
            sscanf(value, "%s", ps_app_ctx->ac_op_fname);
            break;

        case CHKSUM:
            sscanf(value, "%s", ps_app_ctx->ac_op_chksum_fname);
            break;

        case SAVE_OUTPUT:
            sscanf(value, "%d", &ps_app_ctx->u4_file_save_flag);
            break;

        case SAVE_CHKSUM:
            sscanf(value, "%d", &ps_app_ctx->u4_chksum_save_flag);
            break;

        case CHROMA_FORMAT:
            if((strcmp(value, "YUV_420P")) == 0)
                ps_app_ctx->e_output_chroma_format = IV_YUV_420P;
            else if((strcmp(value, "YUV_422ILE")) == 0)
                ps_app_ctx->e_output_chroma_format = IV_YUV_422ILE;
            else if((strcmp(value, "RGB_565")) == 0)
                ps_app_ctx->e_output_chroma_format = IV_RGB_565;
            else if((strcmp(value, "RGBA_8888")) == 0)
                ps_app_ctx->e_output_chroma_format = IV_RGBA_8888;
            else if((strcmp(value, "YUV_420SP_UV")) == 0)
                ps_app_ctx->e_output_chroma_format = IV_YUV_420SP_UV;
            else if((strcmp(value, "YUV_420SP_VU")) == 0)
                ps_app_ctx->e_output_chroma_format = IV_YUV_420SP_VU;
            else
            {
                printf("\nInvalid colour format setting it to IV_YUV_420P\n");
                ps_app_ctx->e_output_chroma_format = IV_YUV_420P;
            }

            break;
        case NUM_FRAMES:
            sscanf(value, "%d", &ps_app_ctx->u4_max_frm_ts);
            break;

        case NUM_CORES:
            sscanf(value, "%d", &ps_app_ctx->u4_num_cores);
            break;
        case DEGRADE_PICS:
            sscanf(value, "%d", &ps_app_ctx->i4_degrade_pics);
            break;
        case DEGRADE_TYPE:
            sscanf(value, "%d", &ps_app_ctx->i4_degrade_type);
            break;
        case SHARE_DISPLAY_BUF:
            sscanf(value, "%d", &ps_app_ctx->share_disp_buf);
            break;
        case LOOPBACK:
            sscanf(value, "%d", &ps_app_ctx->loopback);
            break;
        case DISPLAY:
#if defined(SDL_DISPLAY) || defined(FBDEV_DISPLAY) || defined(INTEL_CE5300) || defined(IOS_DISPLAY)
            sscanf(value, "%d", &ps_app_ctx->display);
#else
            ps_app_ctx->display = 0;
#endif
            break;
        case FULLSCREEN:
            sscanf(value, "%d", &ps_app_ctx->full_screen);
            break;
        case FPS:
            sscanf(value, "%d", &ps_app_ctx->fps);
            if(ps_app_ctx->fps <= 0)
                ps_app_ctx->fps = DEFAULT_FPS;
            break;
        case ARCH:
            if((strcmp(value, "ARM_NONEON")) == 0)
                ps_app_ctx->e_arch = ARCH_ARM_NONEON;
            else if((strcmp(value, "ARM_A9Q")) == 0)
                ps_app_ctx->e_arch = ARCH_ARM_A9Q;
            else if((strcmp(value, "ARM_A7")) == 0)
                ps_app_ctx->e_arch = ARCH_ARM_A7;
            else if((strcmp(value, "ARM_A5")) == 0)
                ps_app_ctx->e_arch = ARCH_ARM_A5;
            else if((strcmp(value, "ARM_NEONINTR")) == 0)
                ps_app_ctx->e_arch = ARCH_ARM_NEONINTR;
            else if((strcmp(value, "X86_GENERIC")) == 0)
                ps_app_ctx->e_arch = ARCH_X86_GENERIC;
            else if((strcmp(value, "X86_SSSE3")) == 0)
                ps_app_ctx->e_arch = ARCH_X86_SSSE3;
            else if((strcmp(value, "X86_SSE42")) == 0)
                ps_app_ctx->e_arch = ARCH_X86_SSE42;
            else if((strcmp(value, "X86_AVX2")) == 0)
                ps_app_ctx->e_arch = ARCH_X86_AVX2;
            else if((strcmp(value, "MIPS_GENERIC")) == 0)
                ps_app_ctx->e_arch = ARCH_MIPS_GENERIC;
            else if((strcmp(value, "MIPS_32")) == 0)
                ps_app_ctx->e_arch = ARCH_MIPS_32;
            else if((strcmp(value, "ARMV8_GENERIC")) == 0)
                ps_app_ctx->e_arch = ARCH_ARMV8_GENERIC;
            else
            {
                printf("\nInvalid Arch. Setting it to ARM_A9Q\n");
                ps_app_ctx->e_arch = ARCH_ARM_A9Q;
            }

            break;
        case SOC:
            if((strcmp(value, "GENERIC")) == 0)
                ps_app_ctx->e_soc = SOC_GENERIC;
            else if((strcmp(value, "HISI_37X")) == 0)
                ps_app_ctx->e_soc = SOC_HISI_37X;
            else
            {
                ps_app_ctx->e_soc = atoi(value);
/*
                printf("\nInvalid SOC. Setting it to GENERIC\n");
                ps_app_ctx->e_soc = SOC_GENERIC;
*/
            }
            break;
        case PICLEN:
            sscanf(value, "%d", &ps_app_ctx->u4_piclen_flag);
            break;

        case PICLEN_FILE:
            sscanf(value, "%s", ps_app_ctx->ac_piclen_fname);
            break;

        case INVALID:
        default:
            printf("Ignoring argument :  %s\n", argument);
            break;
    }
}